

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::Expect(AsciiParser *this,char expect_c)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint8_t uVar3;
  StreamReader *pSVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  string msg;
  ostringstream ss_e;
  string local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  uint8_t *local_1e8;
  undefined8 local_1e0;
  uint8_t local_1d8;
  undefined1 uStack_1d7;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8;
  undefined1 uStack_1b7;
  undefined6 uStack_1b6;
  long *local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 uStack_190;
  ios_base local_138 [264];
  
  bVar5 = SkipWhitespace(this);
  if (bVar5) {
    pSVar4 = this->_sr;
    uVar11 = pSVar4->idx_ + 1;
    if (uVar11 <= pSVar4->length_) {
      uVar3 = pSVar4->binary_[pSVar4->idx_];
      pSVar4->idx_ = uVar11;
      if (uVar3 == expect_c) {
        piVar1 = &(this->_curr_cursor).col;
        *piVar1 = *piVar1 + 1;
        return true;
      }
      local_1c0 = 1;
      uStack_1b7 = 0;
      local_1c8 = &local_1b8;
      local_1b8 = expect_c;
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x3ee246);
      local_208 = &local_1f8;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_1f8 = *plVar9;
        lStack_1f0 = plVar6[3];
      }
      else {
        local_1f8 = *plVar9;
        local_208 = (long *)*plVar6;
      }
      local_200 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_208);
      paVar2 = &local_248.field_2;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_248.field_2._M_allocated_capacity = *puVar10;
        local_248.field_2._8_8_ = plVar6[3];
        local_248._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_248.field_2._M_allocated_capacity = *puVar10;
        local_248._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_248._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1e0 = 1;
      uStack_1d7 = 0;
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar2) {
        uVar11 = local_248.field_2._M_allocated_capacity;
      }
      local_1e8 = &local_1d8;
      local_1d8 = uVar3;
      if ((local_248._M_string_length + 1 < 0x10) && (uVar11 < local_248._M_string_length + 1)) {
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
      }
      else {
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::_M_append((char *)&local_248,(ulong)&local_1d8);
      }
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_198 = *plVar6;
        uStack_190 = puVar7[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar6;
        local_1a8 = (long *)*puVar7;
      }
      local_1a0 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_1a8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_218 = *plVar9;
        lStack_210 = plVar6[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *plVar9;
        local_228 = (long *)*plVar6;
      }
      local_220 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,CONCAT62(uStack_1d6,CONCAT11(uStack_1d7,local_1d8)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,CONCAT62(uStack_1b6,CONCAT11(uStack_1b7,local_1b8)) + 1);
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Expect",6);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8f6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,(char *)local_228,local_220);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      ::std::ios_base::~ios_base(local_138);
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::Expect(char expect_c) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    // this should not happen.
    return false;
  }

  bool ret = (c == expect_c);

  if (!ret) {
    std::string msg = "Expected `" + std::string(&expect_c, 1) + "` but got `" +
                      std::string(&c, 1) + "`\n";
    PUSH_ERROR_AND_RETURN(msg);

    // unwind
    _sr->seek_from_current(-1);
  } else {
    _curr_cursor.col++;
  }

  return ret;
}